

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  xml_allocator *this;
  bool bVar1;
  char_t *__dest;
  char_t *buf;
  xml_allocator *alloc_1;
  xml_allocator *alloc;
  size_t source_length_local;
  char_t *source_local;
  uintptr_t header_mask_local;
  unsigned_long *header_local;
  char **dest_local;
  
  if (source_length == 0) {
    if ((*header & header_mask) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string
                (*(xml_allocator **)((long)header - (*header >> 8)),(char_t *)*dest);
    }
    *dest = (char *)0x0;
    *header = (header_mask ^ 0xffffffffffffffff) & *header;
    dest_local._7_1_ = true;
  }
  else if ((*dest == (char *)0x0) ||
          (bVar1 = anon_unknown_0::strcpy_insitu_allow<unsigned_long>
                             (source_length,header,header_mask,(char_t *)*dest), !bVar1)) {
    this = *(xml_allocator **)((long)header - (*header >> 8));
    bVar1 = anon_unknown_0::xml_allocator::reserve(this);
    if (bVar1) {
      __dest = anon_unknown_0::xml_allocator::allocate_string(this,source_length + 1);
      if (__dest == (char_t *)0x0) {
        dest_local._7_1_ = false;
      }
      else {
        memcpy(__dest,source,source_length);
        __dest[source_length] = '\0';
        if ((*header & header_mask) != 0) {
          anon_unknown_0::xml_allocator::deallocate_string(this,(char_t *)*dest);
        }
        *dest = (char *)__dest;
        *header = header_mask | *header;
        dest_local._7_1_ = true;
      }
    }
    else {
      dest_local._7_1_ = false;
    }
  }
  else {
    memcpy(*dest,source,source_length);
    (*dest)[source_length] = '\0';
    dest_local._7_1_ = true;
  }
  return dest_local._7_1_;
}

Assistant:

PUGI__FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = 0;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}